

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.cpp
# Opt level: O2

void __thiscall
TPZMatrixSolver<std::complex<double>_>::TPZMatrixSolver
          (TPZMatrixSolver<std::complex<double>_> *this,void **vtt,
          TPZMatrixSolver<std::complex<double>_> *Source)

{
  (this->super_TPZSolver).super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[2];
  (this->super_TPZSolver).super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZSolver).super_TPZSavable._vptr_TPZSavable = (_func_int **)*vtt;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::TPZAutoPointer(&this->fReferenceMatrix);
  TPZFMatrix<std::complex<double>_>::TPZFMatrix(&this->fScratch);
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::TPZAutoPointer(&this->fContainer);
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::operator=
            (&this->fReferenceMatrix,&Source->fReferenceMatrix);
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::operator=
            (&this->fContainer,&Source->fContainer);
  return;
}

Assistant:

TPZMatrixSolver<TVar>::TPZMatrixSolver(const TPZMatrixSolver<TVar> &Source) :
fScratch()
{
	fReferenceMatrix = Source.fReferenceMatrix;
	fContainer = Source.fContainer;
}